

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_functions.h
# Opt level: O3

void output_vec<std::vector<float,std::allocator<float>>>
               (vector<float,_std::allocator<float>_> *vec,ostream *stream)

{
  ostream *poVar1;
  float *pfVar2;
  
  pfVar2 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (pfVar2 != (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      poVar1 = std::ostream::_M_insert<double>((double)*pfVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      pfVar2 = pfVar2 + 1;
    } while (pfVar2 != (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  return;
}

Assistant:

void output_vec(T vec, std::ostream & stream=std::clog) 
{
  for (auto it = vec.begin(); it != vec.end(); ++it)
  {
    stream << *it << " ";
  }
  stream << "\n";
  return;
}